

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  unsigned_long *puVar1;
  unsigned_long local_38;
  int local_2c;
  size_type sStack_28;
  int i;
  size_type pos_local;
  StringPiece *pSStack_18;
  char c_local;
  StringPiece *this_local;
  
  if (0 < this->length_) {
    local_38 = (unsigned_long)(this->length_ + -1);
    sStack_28 = pos;
    pos_local._7_1_ = c;
    pSStack_18 = this;
    puVar1 = std::min<unsigned_long>(&stack0xffffffffffffffd8,&local_38);
    for (local_2c = (int)*puVar1; -1 < local_2c; local_2c = local_2c + -1) {
      if (this->ptr_[local_2c] == pos_local._7_1_) {
        return (long)local_2c;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

StringPiece::size_type StringPiece::rfind(char c, size_type pos) const {
  if (length_ <= 0) return npos;
  for (int i = static_cast<int>(min(pos, static_cast<size_type>(length_ - 1)));
       i >= 0; --i) {
    if (ptr_[i] == c) {
      return i;
    }
  }
  return npos;
}